

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitFunctionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,FunctionStmt *stmt)

{
  pointer pPVar1;
  BlockExpr *pBVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pPVar5;
  string local_1f8 [32];
  string separator;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar4 = std::operator<<(local_1a8,"(Stmt::Function ");
  poVar4 = std::operator<<(poVar4,(string *)&(stmt->name).lexeme);
  std::operator<<(poVar4," (");
  separator._M_dataplus._M_p = (pointer)&separator.field_2;
  separator._M_string_length = 0;
  separator.field_2._M_local_buf[0] = '\0';
  pPVar1 = (stmt->params).
           super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar5 = (stmt->params).
                super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
    poVar4 = std::operator<<(local_1a8,(string *)&separator);
    poVar4 = std::operator<<(poVar4,(string *)&(pPVar5->name).lexeme);
    poVar4 = std::operator<<(poVar4,' ');
    iVar3 = (*((pPVar5->typename_)._M_t.
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
    std::__cxx11::string::assign((char *)&separator);
  }
  poVar4 = std::operator<<(local_1a8,") ");
  iVar3 = (*((stmt->returnTypename)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
  std::operator<<(poVar4," (\n");
  std::__cxx11::string::append((char *)&this->m_ident);
  pBVar2 = (stmt->body)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar2->super_Expr)._vptr_Expr[2])(local_1f8,pBVar2,&this->field_0x8);
  std::operator<<(local_1a8,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::operator<<(local_1a8,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&separator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitFunctionStmt(FunctionStmt &stmt) {
        std::stringstream s;

        s << "(Stmt::Function " << stmt.name.lexeme << " (";

        std::string separator;
        for (auto &param : stmt.params) {
            s << separator << param.name.lexeme << ' ' << param.typename_->name();
            separator = " ";
        }

        s << ") " << stmt.returnTypename->name() << " (\n";
        m_ident += "    ";

        s << visitExpr(*stmt.body);

        m_ident.erase(0, 4);
        s << ')';

        return s.str();
    }